

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtobj.cpp
# Opt level: O2

void __thiscall CVmObjTads::change_superclass_list(CVmObjTads *this,vm_val_t *lst,int cnt)

{
  vm_tadsobj_hdr *hdr;
  int idx;
  long lVar1;
  uint uVar2;
  vm_val_t ele;
  
  hdr = (vm_tadsobj_hdr *)(this->super_CVmObject).ext_;
  uVar2 = 0;
  if (0 < cnt) {
    uVar2 = cnt;
  }
  if (0xfffe < (int)uVar2) {
    uVar2 = 0xffff;
  }
  if (hdr->sc_cnt < uVar2) {
    hdr = vm_tadsobj_hdr::expand_to(this,hdr,(ulong)uVar2,(ulong)hdr->prop_entry_cnt);
    (this->super_CVmObject).ext_ = (char *)hdr;
  }
  hdr->sc_cnt = (unsigned_short)uVar2;
  idx = 1;
  for (lVar1 = 0; (ulong)uVar2 * 0x10 != lVar1; lVar1 = lVar1 + 0x10) {
    vm_val_t::ll_index(lst,&ele,idx);
    *(vm_obj_id_t *)((long)&hdr->sc[0].id + lVar1) = ele.val.obj;
    *(CVmObjPageEntry **)((long)&hdr->sc[0].objp + lVar1) =
         G_obj_table_X.pages_[ele.val.obj >> 0xc] + (ele.val.obj & 0xfff);
    idx = idx + 1;
  }
  vm_tadsobj_hdr::inval_inh_path(hdr);
  return;
}

Assistant:

void CVmObjTads::change_superclass_list(VMG_ const vm_val_t *lst, int cnt)
{
    vm_tadsobj_hdr *hdr = get_hdr();
    int i;

    /* keep the count within range */
    cnt = (cnt > UINT16MAXVAL ? UINT16MAXVAL : cnt < 0 ? 0 : cnt);
    
    /* 
     *   if we're increasing the number of superclasses, expand our object
     *   header to make room 
     */
    if (cnt > (int)hdr->sc_cnt)
    {
        /* expand the header to accomodate the new superclass list */
        ext_ = (char *)vm_tadsobj_hdr::expand_to(
            vmg_ this, hdr, cnt, hdr->prop_entry_cnt);

        /* get the new header */
        hdr = get_hdr();
    }

    /* set the new superclass count */
    hdr->sc_cnt = (ushort)cnt;

    /* set the new superclasses */
    for (i = 0 ; i < cnt ; ++i)
    {
        vm_val_t ele;

        /* get this element from the list */
        lst->ll_index(vmg_ &ele, i+1);

        /* set this superclass in the header */
        hdr->sc[i].id = ele.val.obj;
        hdr->sc[i].objp = (CVmObjTads *)vm_objp(vmg_ ele.val.obj);
    }

    /* invalidate the cached inheritance path */
    hdr->inval_inh_path();
}